

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenstream.h
# Opt level: O2

Token * embree::Token::Sym(Token *__return_storage_ptr__,string *str)

{
  ParseLocation local_58;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,(string *)str);
  local_58.fileName.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_58.fileName.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_58.lineNumber._0_4_ = 0xffffffff;
  local_58.lineNumber._4_4_ = 0xffffffff;
  local_58.colNumber._0_4_ = 0xffffffff;
  local_58.colNumber._4_4_ = 0xffffffff;
  Token(__return_storage_ptr__,&local_30,TY_SYMBOL,&local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_58.fileName.
              super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

static Token Sym(std::string str) { return Token(str,TY_SYMBOL); }